

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

CommaSeparatedList * __thiscall
soul::StructuralParser::parseCommaSeparatedListOfExpressions
          (StructuralParser *this,bool canContainTypes,bool canContainProcessors)

{
  size_t sVar1;
  bool bVar2;
  CommaSeparatedList *pCVar3;
  Expression *pEVar4;
  ulong uVar5;
  Context local_f0;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_f0.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_f0.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_f0.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_f0.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_f0.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_f0.parentScope = this->currentScope;
  pCVar3 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context>
                     (&this->allocator->pool,&local_f0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_f0.location.sourceCode.object);
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
  if (bVar2) {
    return pCVar3;
  }
  pEVar4 = parseExpression(this,false);
  uVar5 = (pCVar3->items).numActive;
  if (uVar5 < 0x10000) {
    do {
      if (pEVar4->kind == type && !canContainTypes) {
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,"Type references are not allowed in this context");
        AST::Context::throwError(&(pEVar4->super_Statement).super_ASTObject.context,&local_a0,false)
        ;
      }
      if (pEVar4->kind == processor && !canContainProcessors) {
        CompileMessageHelpers::createMessage<>
                  (&local_d8,syntax,error,"Processor references are not allowed in this context");
        AST::Context::throwError(&(pEVar4->super_Statement).super_ASTObject.context,&local_d8,false)
        ;
      }
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                (&pCVar3->items,uVar5 + 1);
      sVar1 = (pCVar3->items).numActive;
      (pCVar3->items).items[sVar1].object = pEVar4;
      (pCVar3->items).numActive = sVar1 + 1;
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
      if (bVar2) {
        return pCVar3;
      }
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fab);
      pEVar4 = parseExpression(this,false);
      uVar5 = (pCVar3->items).numActive;
    } while (uVar5 < 0x10000);
  }
  CompileMessageHelpers::createMessage<>
            (&local_68,syntax,error,"Initialiser list exceeds max length limit");
  AST::Context::throwError(&(pEVar4->super_Statement).super_ASTObject.context,&local_68,false);
}

Assistant:

AST::CommaSeparatedList& parseCommaSeparatedListOfExpressions (bool canContainTypes, bool canContainProcessors)
    {
        auto& list = allocate<AST::CommaSeparatedList> (getContext());

        if (! matchIf (Operator::closeParen))
        {
            for (;;)
            {
                auto& e = parseExpression();

                if (list.items.size() >= AST::maxInitialiserListLength)
                    e.context.throwError (Errors::tooManyInitialisers());

                if (! canContainTypes && e.kind == AST::ExpressionKind::type)
                    e.context.throwError (Errors::typeReferenceNotAllowed());

                if (! canContainProcessors && e.kind == AST::ExpressionKind::processor)
                    e.context.throwError (Errors::processorReferenceNotAllowed());

                list.items.push_back (e);

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }

        return list;
    }